

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

Instr * __thiscall
IR::Instr::ConvertToBailOutInstr
          (Instr *this,BailOutInfo *bailOutInfo,BailOutKind kind,bool useAuxBailOut)

{
  RealCount *pRVar1;
  IRKind IVar2;
  char cVar3;
  LabelInstr *pLVar4;
  LabelInstr *this_00;
  code *pcVar5;
  bool bVar6;
  BailOutKind BVar7;
  undefined4 *puVar8;
  BailOutInstrTemplate<IR::BranchInstr> *branchRef;
  Type pSVar9;
  undefined8 extraout_RAX;
  Instr *pIVar10;
  char *error;
  uint lineNumber;
  char *pcVar11;
  undefined4 *local_38;
  
  pcVar11 = (char *)this;
  if ((this->field_0x38 & 0x10) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    pcVar11 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp";
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xcb5,"(!this->HasBailOutInfo())","!this->HasBailOutInfo()");
    if (!bVar6) goto LAB_004c1334;
    *puVar8 = 0;
  }
  if ((useAuxBailOut) && ((this->field_0x38 & 0x40) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    pcVar11 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp";
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xcb7,"(!useAuxBailOut || !this->HasAuxBailOut())","Already aux bail out!");
    if (!bVar6) goto LAB_004c1334;
    *puVar8 = 0;
  }
  if ((this->field_0x38 & 0x40) != 0) {
    pcVar11 = (char *)this;
    BVar7 = GetAuxBailOutKind(this);
    if (BVar7 == BailOutInvalid) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      pcVar11 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
      ;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0xcb8,
                         "(!this->HasAuxBailOut() || this->GetAuxBailOutKind() != IR::BailOutInvalid)"
                         ,
                         "!this->HasAuxBailOut() || this->GetAuxBailOutKind() != IR::BailOutInvalid"
                        );
      if (!bVar6) goto LAB_004c1334;
      *puVar8 = 0;
    }
  }
  if ((this->field_0x38 & 0x40) != 0) {
    BVar7 = GetAuxBailOutKind(this);
    if ((BVar7 & ~(BailOutIgnoreException|BailOutForceByFlag)) != BailOutInvalid) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0xcc2,
                         "((this->GetAuxBailOutKind() & ~(IR::BailOutIgnoreException | IR::BailOutForceByFlag)) == 0)"
                         ,"Only IR::BailOutIgnoreException|ForceByFlag supported here.");
      if (!bVar6) goto LAB_004c1334;
      *puVar8 = 0;
    }
    SetBailOutKind_NoAssert(this,kind);
    ReplaceBailOutInfo(this,bailOutInfo);
    bailOutInfo->bailOutInstr = this;
    this->field_0x38 = this->field_0x38 | 0x10;
    goto LAB_004c12fe;
  }
  IVar2 = this->m_kind;
  if (IVar2 == InstrKindProfiled) {
    branchRef = (BailOutInstrTemplate<IR::BranchInstr> *)
                BailOutInstrTemplate<IR::ProfiledInstr>::New
                          (this->m_opcode,kind,bailOutInfo,bailOutInfo->bailOutFunc);
    if (this->m_kind != InstrKindProfiled) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
      if (!bVar6) goto LAB_004c1334;
      *puVar8 = 0;
    }
    if ((branchRef->super_BranchInstr).super_Instr.m_kind != InstrKindProfiled) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
      if (!bVar6) goto LAB_004c1334;
      *puVar8 = 0;
    }
    *(anon_union_8_4_88fdcd80_for_u *)&(branchRef->super_BranchInstr).field_0x58 =
         *(anon_union_8_4_88fdcd80_for_u *)(this + 1);
  }
  else if (IVar2 == InstrKindBranch) {
    pIVar10 = this[1].m_next;
    cVar3 = *(char *)((long)&this[1]._vptr_Instr + 1);
    if (pIVar10 == (Instr *)0x0) {
      if (cVar3 == '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        local_38 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *local_38 = 1;
        error = "(m_isMultiBranch)";
        pcVar11 = "m_isMultiBranch";
        lineNumber = 0x20e;
        goto LAB_004c1188;
      }
    }
    else if (cVar3 != '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      local_38 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *local_38 = 1;
      error = "(!m_isMultiBranch)";
      pcVar11 = "!m_isMultiBranch";
      lineNumber = 0x209;
LAB_004c1188:
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,lineNumber,error,pcVar11);
      if (!bVar6) goto LAB_004c1334;
      *local_38 = 0;
    }
    if (pIVar10 == (Instr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0xcdf,"(!branchInstr->IsMultiBranch())","!branchInstr->IsMultiBranch()");
      if (!bVar6) goto LAB_004c1334;
      *puVar8 = 0;
    }
    branchRef = BailOutInstrTemplate<IR::BranchInstr>::New
                          (this->m_opcode,kind,bailOutInfo,bailOutInfo->bailOutFunc);
    pLVar4 = (LabelInstr *)this[1].m_next;
    if ((branchRef->super_BranchInstr).m_isMultiBranch == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x1d3,"(!this->m_isMultiBranch)","!this->m_isMultiBranch");
      if (!bVar6) {
LAB_004c1334:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar8 = 0;
    }
    this_00 = (branchRef->super_BranchInstr).m_branchTarget;
    if (this_00 != (LabelInstr *)0x0) {
      LabelInstr::RemoveLabelRef(this_00,&branchRef->super_BranchInstr);
    }
    if (pLVar4 != (LabelInstr *)0x0) {
      pSVar9 = (Type)new<Memory::ArenaAllocator>
                               (0x10,(pLVar4->labelRefs).
                                     super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>
                                     .allocator,0x366bee);
      pSVar9[1].next = (Type)branchRef;
      pSVar9->next = (pLVar4->labelRefs).
                     super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                     super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                     super_SListNodeBase<Memory::ArenaAllocator>.next;
      (pLVar4->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
      super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
      super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar9;
      pRVar1 = &(pLVar4->labelRefs).
                super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                super_RealCount;
      pRVar1->count = pRVar1->count + 1;
    }
    (branchRef->super_BranchInstr).m_branchTarget = pLVar4;
    (branchRef->super_BranchInstr).m_byteCodeReg = *(RegSlot *)&this[1].m_prev;
  }
  else {
    if (IVar2 != InstrKindInstr) {
      ConvertToBailOutInstr();
      if ((((Instr *)pcVar11)->field_0x38 & 0x10) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                           ,0xd04,"(!this->HasBailOutInfo())","!this->HasBailOutInfo()");
        if (!bVar6) goto LAB_004c1429;
        *puVar8 = 0;
      }
      BVar7 = GetAuxBailOutKind((Instr *)pcVar11);
      if (BVar7 == BailOutInvalid) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                           ,0xd05,"(this->GetAuxBailOutKind() != IR::BailOutInvalid)",
                           "this->GetAuxBailOutKind() != IR::BailOutInvalid");
        if (!bVar6) {
LAB_004c1429:
          pcVar5 = (code *)invalidInstructionException();
          (*pcVar5)();
        }
        *puVar8 = 0;
      }
      BVar7 = GetAuxBailOutKind((Instr *)pcVar11);
      SetBailOutKind_NoAssert((Instr *)pcVar11,BVar7);
      SetAuxBailOutKind((Instr *)pcVar11,BailOutInvalid);
      pIVar10 = (Instr *)(CONCAT71((int7)((ulong)extraout_RAX >> 8),((Instr *)pcVar11)->field_0x38)
                          & 0xffffffffffffffaf | 0x10);
      ((Instr *)pcVar11)->field_0x38 = (char)pIVar10;
      return pIVar10;
    }
    branchRef = (BailOutInstrTemplate<IR::BranchInstr> *)
                BailOutInstrTemplate<IR::Instr>::New
                          (this->m_opcode,kind,bailOutInfo,bailOutInfo->bailOutFunc);
  }
  this->m_next->m_prev = (Instr *)branchRef;
  pIVar10 = this->m_prev;
  pIVar10->m_next = (Instr *)branchRef;
  (branchRef->super_BranchInstr).super_Instr.m_next = this->m_next;
  (branchRef->super_BranchInstr).super_Instr.m_prev = pIVar10;
  TransferTo(this,(Instr *)branchRef);
  Free(this);
  this = (Instr *)branchRef;
LAB_004c12fe:
  if (useAuxBailOut) {
    SetAuxBailOutKind(this,kind);
    SetBailOutKind_NoAssert(this,BailOutInvalid);
    (((BailOutInstrTemplate<IR::BranchInstr> *)this)->super_BranchInstr).super_Instr.field_0x38 =
         (((BailOutInstrTemplate<IR::BranchInstr> *)this)->super_BranchInstr).super_Instr.field_0x38
         & 0xaf | 0x40;
  }
  return (Instr *)(BailOutInstrTemplate<IR::BranchInstr> *)this;
}

Assistant:

IR::Instr *
Instr::ConvertToBailOutInstr(BailOutInfo * bailOutInfo, IR::BailOutKind kind, bool useAuxBailOut /* = false */)
{
    Assert(!this->HasBailOutInfo());

    AssertMsg(!useAuxBailOut || !this->HasAuxBailOut(), "Already aux bail out!");
    Assert(!this->HasAuxBailOut() || this->GetAuxBailOutKind() != IR::BailOutInvalid);

    IR::Instr * bailOutInstr = nullptr;
    if (this->HasAuxBailOut())
    {
        // This instr has already been converted to bailout instr. Only possible with aux bail out.
        // Typical scenario is when globopt calls to convert to e.g. BailOutOnImplicitCalls for the instr which
        // was already converted to bail out instr with HasBailOutInfo() == false and HasAuxBailOutInfo() == true,
        // so that aux bail out is hidden in between IRBuilder and lowerer.

        AssertMsg((this->GetAuxBailOutKind() & ~(IR::BailOutIgnoreException | IR::BailOutForceByFlag)) == 0, "Only IR::BailOutIgnoreException|ForceByFlag supported here.");
        // What we rely on here is:
        // - bailout doesn't have any args.
        // - bailout doesn't use offset as we get it from DebuggingFlags at time of bailout.

        // Use prev debugger bailout kind as decoration, while keeping new kind as main.
        this->SetBailOutKind_NoAssert(kind);

        // Clear old (aux) info and set to the new bailOutInfo.
        this->ReplaceBailOutInfo(bailOutInfo);
        bailOutInfo->bailOutInstr = this;
        this->hasBailOutInfo = true;

        bailOutInstr = this;
    }
    else
    {
        switch (this->m_kind)
        {
        case InstrKindInstr:
            bailOutInstr = IR::BailOutInstr::New(this->m_opcode, kind, bailOutInfo, bailOutInfo->bailOutFunc);
            break;
        case InstrKindProfiled:
            bailOutInstr = IR::ProfiledBailOutInstr::New(this->m_opcode, kind, bailOutInfo, bailOutInfo->bailOutFunc);
            bailOutInstr->AsProfiledInstr()->u = this->AsProfiledInstr()->u;
            break;
        case InstrKindBranch:
        {
            IR::BranchInstr * branchInstr = this->AsBranchInstr();
            Assert(!branchInstr->IsMultiBranch());
            IR::BranchBailOutInstr * branchBailOutInstr = IR::BranchBailOutInstr::New(this->m_opcode, kind, bailOutInfo, bailOutInfo->bailOutFunc);
            branchBailOutInstr->SetTarget(branchInstr->GetTarget());
            branchBailOutInstr->SetByteCodeReg(branchInstr->GetByteCodeReg());
            bailOutInstr = branchBailOutInstr;
            break;
        }
        default:
            AnalysisAssert(false);
        };

        this->m_next->m_prev = bailOutInstr;
        this->m_prev->m_next = bailOutInstr;
        bailOutInstr->m_next = this->m_next;
        bailOutInstr->m_prev = this->m_prev;

        this->TransferTo(bailOutInstr);

        this->Free();
    }

    if (useAuxBailOut)
    {
        // Move bail out kind from bailOutKind to auxBailOutKind and hide bailOutInfo as if this is not a bail out instr.
        bailOutInstr->SetAuxBailOutKind(kind);
        bailOutInstr->SetBailOutKind_NoAssert(IR::BailOutInvalid);
        bailOutInstr->hasBailOutInfo = false;
        bailOutInstr->hasAuxBailOut = true;
    }

    return bailOutInstr;
}